

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

QualifiedIdentifier * __thiscall
soul::PoolAllocator::
allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
          (PoolAllocator *this,Context *args,IdentifierPath *args_1)

{
  IdentifierPath *c;
  Context *this_00;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_95 [13];
  IdentifierPath local_88;
  QualifiedIdentifier *local_30;
  QualifiedIdentifier *newObject;
  PoolItem *newItem;
  IdentifierPath *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_1;
  args_local_1 = (IdentifierPath *)args;
  args_local = (Context *)this;
  newObject = (QualifiedIdentifier *)allocateSpaceForObject(this,0xa0);
  c = args_local_1;
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  IdentifierPath::IdentifierPath(&local_88,(IdentifierPath *)newItem);
  AST::QualifiedIdentifier::QualifiedIdentifier
            ((QualifiedIdentifier *)this_00,(Context *)c,&local_88);
  IdentifierPath::~IdentifierPath(&local_88);
  local_30 = (QualifiedIdentifier *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::IdentifierPath&&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(local_95);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_30;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }